

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::append(String *this,char *s,size_t n)

{
  undefined1 local_40 [8];
  String tmp;
  size_t n_local;
  char *s_local;
  String *this_local;
  
  tmp.mString.field_2._8_8_ = n;
  String((String *)local_40,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  append(&this->mString,
         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_40);
  ~String((String *)local_40);
  return this;
}

Assistant:

String& String::append( const char* s, size_t n ) {
	String tmp( s );

	mString.append( tmp.mString );

	return *this;
}